

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert-expr.c
# Opt level: O2

ExprNode * parse(ptrlen expr,char **error_msg,ptrlen *error_loc)

{
  ExprNode *en;
  char *ptr;
  void *pvVar1;
  ptrlen pVar2;
  ParserState local_88;
  
  pvVar1 = expr.ptr;
  local_88.lasttoktext.len = 0;
  local_88.err = (char *)0x0;
  local_88.currtext.ptr = pvVar1;
  local_88.currtext.len = expr.len;
  local_88.lasttoktext.ptr = pvVar1;
  advance(&local_88);
  en = parse_expr(&local_88);
  if ((en == (ExprNode *)0x0) || (local_88.tok == TOK_END)) {
    if (en != (ExprNode *)0x0) {
      return en;
    }
  }
  else {
    ptr = dupstr("unexpected text at end of expression");
    pVar2 = make_ptrlen_startend(local_88.toktext.ptr,(void *)((long)pvVar1 + expr.len));
    if (local_88.err != (char *)0x0) {
      safefree(ptr);
      ptr = local_88.err;
      pVar2 = local_88.errloc;
    }
    local_88.errloc = pVar2;
    local_88.err = ptr;
    exprnode_free(en);
  }
  if (error_msg == (char **)0x0) {
    safefree(local_88.err);
  }
  else {
    *error_msg = local_88.err;
  }
  if (error_loc != (ptrlen *)0x0) {
    error_loc->ptr = local_88.errloc.ptr;
    error_loc->len = local_88.errloc.len;
  }
  return (ExprNode *)0x0;
}

Assistant:

static ExprNode *parse(ptrlen expr, char **error_msg, ptrlen *error_loc)
{
    ParserState ps[1];
    ps->currtext = expr;
    ps->lasttoktext = make_ptrlen(ps->currtext.ptr, 0);
    ps->err = NULL;
    advance(ps);

    ExprNode *en = parse_expr(ps);
    if (en && ps->tok != TOK_END) {
        error(ps, dupstr("unexpected text at end of expression"),
              make_ptrlen_startend(ps->toktext.ptr, ptrlen_end(expr)));
        exprnode_free(en);
        en = NULL;
    }

    if (!en) {
        if (error_msg)
            *error_msg = ps->err;
        else
            sfree(ps->err);
        if (error_loc)
            *error_loc = ps->errloc;
        return NULL;
    }

    return en;
}